

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoProfile.c
# Opt level: O2

void reoProfileWidthStart2(reo_man *p)

{
  short sVar1;
  reo_unit *prVar2;
  reo_plane *prVar3;
  uint uVar4;
  int iVar5;
  reo_unit **pprVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  int *piVar13;
  
  uVar4 = p->nSupp;
  lVar9 = 8;
  for (lVar12 = 0; lVar12 <= (int)uVar4; lVar12 = lVar12 + 1) {
    *(undefined4 *)((long)&p->pPlanes->fSifted + lVar9) = 0;
    lVar9 = lVar9 + 0x38;
  }
  for (lVar9 = 0; lVar9 <= (int)uVar4; lVar9 = lVar9 + 1) {
    pprVar6 = &p->pPlanes[lVar9].pHead;
    while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
      prVar2->TopRef = 30000;
      prVar2->Sign = 0;
      pprVar6 = &prVar2->Next;
    }
  }
  uVar10 = 0;
  uVar7 = (ulong)(uint)p->nTops;
  if (p->nTops < 1) {
    uVar7 = uVar10;
  }
  for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
    *(undefined2 *)(((ulong)p->pTops[uVar10] & 0xfffffffffffffffe) + 2) = 0;
  }
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  while (uVar7 != uVar10) {
    prVar3 = p->pPlanes + uVar7;
    uVar7 = uVar7 + 1;
    pprVar6 = &prVar3->pHead;
    while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
      if ((int)uVar7 < (int)prVar2->pE->TopRef) {
        prVar2->pE->TopRef = (short)uVar7;
      }
      if ((int)uVar7 < (int)prVar2->pT->TopRef) {
        prVar2->pT->TopRef = (short)uVar7;
      }
      pprVar6 = &prVar2->Next;
    }
  }
  lVar12 = 0;
  for (lVar9 = 0; lVar8 = (long)(int)uVar4, lVar9 < lVar8; lVar9 = lVar9 + 1) {
    reoProfileWidthVerifyLevel((reo_plane *)((long)&p->pPlanes->fSifted + lVar12),(int)lVar9);
    uVar4 = p->nSupp;
    lVar12 = lVar12 + 0x38;
  }
  uVar10 = 0;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar7 = uVar10;
  }
  prVar3 = p->pPlanes;
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    pprVar6 = &prVar3[uVar10].pHead;
    while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
      lVar9 = (long)prVar2->TopRef;
      sVar1 = prVar2->lev;
      piVar13 = &prVar3[lVar9].statsWidth;
      for (; lVar9 <= sVar1; lVar9 = lVar9 + 1) {
        *piVar13 = *piVar13 + 1;
        piVar13 = piVar13 + 0xe;
      }
      pprVar6 = &prVar2->Next;
    }
  }
  pprVar6 = &prVar3[lVar8].pHead;
  while (prVar2 = *pprVar6, prVar2 != (reo_unit *)0x0) {
    lVar9 = (long)prVar2->TopRef;
    piVar13 = &prVar3[lVar9].statsWidth;
    for (; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
      *piVar13 = *piVar13 + 1;
      piVar13 = piVar13 + 0xe;
    }
    pprVar6 = &prVar2->Next;
  }
  p->nWidthCur = 0;
  pdVar11 = &prVar3->statsCost;
  iVar5 = 0;
  for (lVar9 = 0; lVar9 <= lVar8; lVar9 = lVar9 + 1) {
    *pdVar11 = (double)*(int *)(pdVar11 + -2);
    iVar5 = iVar5 + *(int *)(pdVar11 + -2);
    p->nWidthCur = iVar5;
    pdVar11 = pdVar11 + 7;
  }
  p->nWidthBeg = iVar5;
  return;
}

Assistant:

void reoProfileWidthStart2( reo_man * p )
{
    reo_unit * pUnit;
    int i, v;

    // clean the profile
    for ( i = 0; i <= p->nSupp; i++ )
        p->pPlanes[i].statsWidth = 0;
    
    // clean the node structures
    for ( v = 0; v <= p->nSupp; v++ )
    for ( pUnit = p->pPlanes[v].pHead; pUnit; pUnit = pUnit->Next )
    {
        pUnit->TopRef = REO_TOPREF_UNDEF;
        pUnit->Sign   = 0;
    }

    // set the topref to the topmost nodes
    for ( i = 0; i < p->nTops; i++ )
        Unit_Regular(p->pTops[i])->TopRef = 0;

    // go through the non-constant nodes and set the topmost level of their cofactors
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
        {
            if ( pUnit->pE->TopRef > i+1 )
                 pUnit->pE->TopRef = i+1;
            if ( pUnit->pT->TopRef > i+1 )
                 pUnit->pT->TopRef = i+1;
        }

    // verify the top reference
    for ( i = 0; i < p->nSupp; i++ )
        reoProfileWidthVerifyLevel( p->pPlanes + i, i );

    // compute the profile for the internal nodes
    for ( i = 0; i < p->nSupp; i++ )
        for ( pUnit = p->pPlanes[i].pHead; pUnit; pUnit = pUnit->Next )
            for ( v = pUnit->TopRef; v <= pUnit->lev; v++ )
                p->pPlanes[v].statsWidth++;

    // compute the profile for the constant nodes
    for ( pUnit = p->pPlanes[p->nSupp].pHead; pUnit; pUnit = pUnit->Next )
        for ( v = pUnit->TopRef; v <= p->nSupp; v++ )
            p->pPlanes[v].statsWidth++;

    // get the width cost
    p->nWidthCur = 0;
    for ( i = 0; i <= p->nSupp; i++ )
    {
        p->pPlanes[i].statsCost = p->pPlanes[i].statsWidth;
        p->nWidthCur           += p->pPlanes[i].statsWidth;
    }
    p->nWidthBeg = p->nWidthCur;
}